

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O1

error destructuring_bind(atom arg_name,atom val,int val_unspecified,atom env)

{
  type tVar1;
  anon_union_8_9_1d3277aa_for_value aVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  error eVar6;
  type tVar7;
  anon_union_8_9_1d3277aa_for_value aVar8;
  ulong uVar9;
  table *tbl;
  atom a;
  atom arg_name_00;
  atom expr;
  atom b;
  atom val_00;
  atom env_00;
  atom v;
  atom local_68;
  anon_union_8_9_1d3277aa_for_value local_58;
  anon_union_8_9_1d3277aa_for_value local_50;
  undefined8 local_48;
  anon_union_8_9_1d3277aa_for_value aStack_40;
  
  local_68.value = val.value;
  aVar8 = arg_name.value;
  uVar9 = arg_name._0_8_;
  tVar7 = val.type;
  do {
    eVar6 = ERROR_ARGS;
    iVar5 = (int)uVar9;
    local_68.type = tVar7;
    local_50 = aVar8;
    if (iVar5 != 1) {
      if (iVar5 == 0) {
        eVar6 = (uint)(tVar7 != T_NIL) * 3;
      }
      else if (iVar5 == 2) {
        tbl = (table *)(env.value.fp)->_IO_read_base;
LAB_001054ef:
        v._4_4_ = 0;
        v.type = local_68.type;
        v.value.number = local_68.value.number;
        table_set_sym(tbl,aVar8.symbol,v);
        eVar6 = ERROR_OK;
      }
      return eVar6;
    }
    tVar1 = ((aVar8.pair)->car).type;
    aVar2 = (anon_union_8_9_1d3277aa_for_value)(aVar8.fp)->_IO_read_ptr;
    b._4_4_ = 0;
    b.type = sym_o.type;
    a._4_4_ = 0;
    a.type = tVar1;
    a.value.pair = aVar2.pair;
    b.value.number = sym_o.value.number;
    local_58 = aVar8;
    iVar5 = is(a,b);
    aVar8 = local_58;
    if (iVar5 != 0) {
      if (((val_unspecified != 0) &&
          (lVar3 = (*local_58.jb)[0].__jmpbuf[3], *(int *)(lVar3 + 0x10) != 0)) &&
         (puVar4 = *(uint **)(lVar3 + 0x18), expr._4_4_ = 0, expr.type = *puVar4, env_00._4_4_ = 0,
         env_00.type = env.type,
         expr.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(puVar4 + 2))->pair,
         env_00.value.number = env.value.number, eVar6 = eval_expr(expr,env_00,&local_68),
         eVar6 != ERROR_OK)) {
        return eVar6;
      }
      aVar8 = (anon_union_8_9_1d3277aa_for_value)
              ((anon_union_8_9_1d3277aa_for_value *)((*aVar8.jb)[0].__jmpbuf[3] + 8))->symbol;
      tbl = (table *)(env.value.fp)->_IO_read_base;
      goto LAB_001054ef;
    }
    if (tVar7 != T_CONS) {
      return ERROR_ARGS;
    }
    val_00._4_4_ = 0;
    val_00.type = ((local_68.value.pair)->car).type;
    arg_name_00._4_4_ = 0;
    arg_name_00.type = tVar1;
    arg_name_00.value.pair = aVar2.pair;
    val_00.value.symbol = (local_68.value.fp)->_IO_read_ptr;
    eVar6 = destructuring_bind(arg_name_00,val_00,0,env);
    if (eVar6 != ERROR_OK) {
      return eVar6;
    }
    tVar7 = ((local_68.value.pair)->cdr).type;
    val_unspecified = (int)(tVar7 == T_NIL);
    uVar9 = (ulong)((local_58.pair)->cdr).type;
    aVar8 = (anon_union_8_9_1d3277aa_for_value)(local_58.fp)->_IO_read_base;
    local_68.value = (anon_union_8_9_1d3277aa_for_value)(local_68.value.fp)->_IO_read_base;
    local_48 = env._0_8_;
    aStack_40 = env.value;
  } while( true );
}

Assistant:

error destructuring_bind(atom arg_name, atom val, int val_unspecified, atom env) {
	switch (arg_name.type) {
	case T_SYM:
		return env_assign(env, arg_name.value.symbol, val);
	case T_CONS:
		if (is(car(arg_name), sym_o)) { /* (o ARG [DEFAULT]) */
			if (val_unspecified) { /* missing argument */
				if (!no(cdr(cdr(arg_name)))) {
					error err = eval_expr(car(cdr(cdr(arg_name))), env, &val);
					if (err) return err;
				}
			}
			return env_assign(env, car(cdr(arg_name)).value.symbol, val);
		}
		else {
			if (val.type != T_CONS) {
				return ERROR_ARGS;
			}
			error err = destructuring_bind(car(arg_name), car(val), 0, env);
			if (err) return err;
			return destructuring_bind(cdr(arg_name), cdr(val), no(cdr(val)), env);
		}
	case T_NIL:
		if (no(val))
			return ERROR_OK;
		else
			return ERROR_ARGS;
	default:
		return ERROR_ARGS;
	}
}